

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

int __thiscall embree::XMLWriter::close(XMLWriter *this,int __fd)

{
  size_t *psVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  
  psVar1 = &this->ident;
  *psVar1 = *psVar1 - 2;
  if (*psVar1 != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->ident);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10,"</",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x10,*(char **)CONCAT44(in_register_00000034,__fd),
                      ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  iVar2 = std::ostream::flush();
  return iVar2;
}

Assistant:

void XMLWriter::close(std::string str)
  {
    assert(ident>=2);
    ident-=2;
    tab(); xml << "</" << str << ">" << std::endl;
  }